

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::Fixed32CasesWithSizes_ReadLittleEndian32_Test::
~Fixed32CasesWithSizes_ReadLittleEndian32_Test(Fixed32CasesWithSizes_ReadLittleEndian32_Test *this)

{
  Fixed32CasesWithSizes_ReadLittleEndian32_Test *this_local;
  
  ~Fixed32CasesWithSizes_ReadLittleEndian32_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_P(Fixed32CasesWithSizes, ReadLittleEndian32) {
  Fixed32Case kFixed32Cases_case = std::get<0>(GetParam());
  int kBlockSizes_case = std::get<1>(GetParam());
  memcpy(buffer_, kFixed32Cases_case.bytes, sizeof(kFixed32Cases_case.bytes));
  ArrayInputStream input(buffer_, sizeof(buffer_), kBlockSizes_case);

  {
    CodedInputStream coded_input(&input);

    uint32_t value;
    EXPECT_TRUE(coded_input.ReadLittleEndian32(&value));
    EXPECT_EQ(kFixed32Cases_case.value, value);
  }

  EXPECT_EQ(sizeof(uint32_t), input.ByteCount());
}